

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cxx::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,FieldDescriptor *field)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  Descriptor *this_00;
  FieldDescriptor *pFVar4;
  int i;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_39;
  undefined1 local_38 [8];
  string field_name;
  FieldDescriptor *field_local;
  string *result;
  
  field_name.field_2._8_8_ = this;
  psVar3 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
  anon_unknown_0::UnderscoresToCamelCase((string *)local_38,psVar3,true);
  local_39 = 0;
  std::operator+(&local_60,"k",(string *)local_38);
  std::operator+(__return_storage_ptr__,&local_60,"FieldNumber");
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)field_name.field_2._8_8_);
  if (!bVar1) {
    this_00 = FieldDescriptor::containing_type((FieldDescriptor *)field_name.field_2._8_8_);
    psVar3 = FieldDescriptor::camelcase_name_abi_cxx11_((FieldDescriptor *)field_name.field_2._8_8_)
    ;
    pFVar4 = Descriptor::FindFieldByCamelcaseName(this_00,psVar3);
    if (pFVar4 != (FieldDescriptor *)field_name.field_2._8_8_) {
      uVar2 = FieldDescriptor::number((FieldDescriptor *)field_name.field_2._8_8_);
      SimpleItoa_abi_cxx11_(&local_b0,(protobuf *)(ulong)uVar2,i);
      std::operator+(&local_90,"_",&local_b0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  local_39 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string field_name = UnderscoresToCamelCase(field->name(), true);
  string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
        field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + SimpleItoa(field->number());
  }

  return result;
}